

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O2

Expression * __thiscall
wasm::ConstHoisting::hoist
          (ConstHoisting *this,
          vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *vec)

{
  Type type;
  pointer pppEVar1;
  Expression **ppEVar2;
  Index index;
  LocalGet *pLVar3;
  pointer pppEVar4;
  Builder local_40;
  Builder builder;
  
  type.id = ((**(vec->super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>)
                ._M_impl.super__Vector_impl_data._M_start)->type).id;
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>_>
       ).super_PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>.
       super_Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>.currModule;
  index = Builder::addVar((this->
                          super_WalkerPass<wasm::PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>_>
                          ).
                          super_PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>
                          .
                          super_Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>
                          .currFunction,type);
  builder.wasm = (Module *)
                 Builder::makeLocalSet
                           (&local_40,index,
                            **(vec->
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              )._M_impl.super__Vector_impl_data._M_start);
  pppEVar1 = (vec->super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  for (pppEVar4 = (vec->
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>).
                  _M_impl.super__Vector_impl_data._M_start; pppEVar4 != pppEVar1;
      pppEVar4 = pppEVar4 + 1) {
    ppEVar2 = *pppEVar4;
    pLVar3 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar3->index = index;
    (pLVar3->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = type.id;
    *ppEVar2 = (Expression *)pLVar3;
  }
  return (Expression *)builder.wasm;
}

Assistant:

Expression* hoist(std::vector<Expression**>& vec) {
    auto type = (*(vec[0]))->type;
    Builder builder(*getModule());
    auto temp = builder.addVar(getFunction(), type);
    auto* ret = builder.makeLocalSet(temp, *(vec[0]));
    for (auto item : vec) {
      *item = builder.makeLocalGet(temp, type);
    }
    return ret;
  }